

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O0

void fdb_gather_stale_blocks
               (fdb_kvs_handle *handle,filemgr_header_revnum_t revnum,bid_t prev_hdr,
               uint64_t kv_info_offset,fdb_seqnum_t seqnum,list_elem *e_last,bool from_mergetree)

{
  long lVar1;
  btree *btree;
  filemgr *file;
  list *plVar2;
  list_elem **__ptr;
  char *__s;
  list_elem *plVar3;
  char *pcVar4;
  undefined8 auStackY_170 [5];
  undefined1 auStackY_148 [8];
  undefined2 in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec2;
  undefined4 in_stack_fffffffffffffec4;
  docio_object doc;
  char *doc_key;
  stale_data *item;
  list_elem *e;
  avl_node *a;
  kvs_stat stat;
  fdb_seqnum_t _seqnum;
  filemgr_header_revnum_t _revnum;
  bool first_loop;
  ulong uStack_98;
  bool gather_staleblocks;
  bid_t _prev_hdr;
  bid_t _doc_offset;
  bid_t doc_offset;
  uint8_t *buf;
  uint64_t _kv_info_offset;
  uint64_t _pos;
  uint local_60;
  uint32_t _len;
  uint32_t _count;
  uint32_t bufsize;
  uint32_t count_location;
  uint32_t offset;
  uint32_t count;
  int r;
  int64_t delta;
  list_elem *plStack_38;
  bool from_mergetree_local;
  list_elem *e_last_local;
  fdb_seqnum_t seqnum_local;
  uint64_t kv_info_offset_local;
  bid_t prev_hdr_local;
  filemgr_header_revnum_t revnum_local;
  fdb_kvs_handle *handle_local;
  
  delta._7_1_ = from_mergetree;
  count_location = 0;
  bufsize = 0;
  _len = 0x2000;
  doc_offset = 0;
  _revnum._7_1_ = 1;
  _revnum._6_1_ = 1;
  plStack_38 = e_last;
  e_last_local = (list_elem *)seqnum;
  seqnum_local = kv_info_offset;
  kv_info_offset_local = prev_hdr;
  prev_hdr_local = revnum;
  revnum_local = (filemgr_header_revnum_t)handle;
  plVar2 = filemgr_get_stale_list(handle->file);
  if (plVar2 == (list *)0x0) {
    btreeblk_reset_subblock_info
              ((btreeblk_handle *)
               CONCAT44(in_stack_fffffffffffffec4,
                        CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0)));
  }
  else {
    offset = _kvs_stat_get((filemgr *)doc.length._8_8_,doc.length._0_8_,
                           (kvs_stat *)
                           CONCAT44(in_stack_fffffffffffffec4,
                                    CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0)));
    *(avl_node **)(*(long *)(revnum_local + 0x58) + 8) = a;
    *(avl_node **)(*(long *)(revnum_local + 0x58) + 0x10) = a;
    doc_offset = (bid_t)calloc(1,(ulong)_len);
    _seqnum = prev_hdr_local >> 0x38 | (prev_hdr_local & 0xff000000000000) >> 0x28 |
              (prev_hdr_local & 0xff0000000000) >> 0x18 | (prev_hdr_local & 0xff00000000) >> 8 |
              (prev_hdr_local & 0xff000000) << 8 | (prev_hdr_local & 0xff0000) << 0x18 |
              (prev_hdr_local & 0xff00) << 0x28 | prev_hdr_local << 0x38;
    memset((void *)doc_offset,0xff,8);
    _count = 8;
    if ((kv_info_offset_local == 0) || (kv_info_offset_local == 0xffffffffffffffff)) {
      memset(&stack0xffffffffffffff68,0xff,8);
    }
    else {
      uStack_98 = kv_info_offset_local >> 0x38 | (kv_info_offset_local & 0xff000000000000) >> 0x28 |
                  (kv_info_offset_local & 0xff0000000000) >> 0x18 |
                  (kv_info_offset_local & 0xff00000000) >> 8 |
                  (kv_info_offset_local & 0xff000000) << 8 |
                  (kv_info_offset_local & 0xff0000) << 0x18 |
                  (kv_info_offset_local & 0xff00) << 0x28 | kv_info_offset_local << 0x38;
    }
    *(ulong *)(doc_offset + 8) = uStack_98;
    buf = (uint8_t *)
          (seqnum_local >> 0x38 | (seqnum_local & 0xff000000000000) >> 0x28 |
           (seqnum_local & 0xff0000000000) >> 0x18 | (seqnum_local & 0xff00000000) >> 8 |
           (seqnum_local & 0xff000000) << 8 | (seqnum_local & 0xff0000) << 0x18 |
           (seqnum_local & 0xff00) << 0x28 | seqnum_local << 0x38);
    *(uint8_t **)(doc_offset + (_count + 8)) = buf;
    *(ulong *)(doc_offset + (_count + 0x10)) =
         (ulong)e_last_local >> 0x38 | ((ulong)e_last_local & 0xff000000000000) >> 0x28 |
         ((ulong)e_last_local & 0xff0000000000) >> 0x18 | ((ulong)e_last_local & 0xff00000000) >> 8
         | ((ulong)e_last_local & 0xff000000) << 8 | ((ulong)e_last_local & 0xff0000) << 0x18 |
         ((ulong)e_last_local & 0xff00) << 0x28 | (long)e_last_local << 0x38;
    _count = _count + 0x1c;
    pcVar4 = auStackY_148;
    while ((_revnum._7_1_ & 1) != 0) {
      bufsize = _count;
      if (((_revnum._6_1_ & 1) == 0) || ((delta._7_1_ & 1) == 0)) {
        if (plStack_38 == (list_elem *)0x0) {
          plVar2 = *(list **)(*(long *)(revnum_local + 0x48) + 0x280);
          *(undefined8 *)(pcVar4 + -8) = 0x16b185;
          item = (stale_data *)list_begin(plVar2);
        }
        else {
          *(undefined8 *)(pcVar4 + -8) = 0x16b168;
          item = (stale_data *)list_next(plStack_38);
        }
        while (item != (stale_data *)0x0) {
          __ptr = &item[-1].field_2.le.next;
          if (*(long *)(revnum_local + 0x38) != 0) {
            count_location = count_location + 1;
            _kv_info_offset =
                 (ulong)*__ptr >> 0x38 | ((ulong)*__ptr & 0xff000000000000) >> 0x28 |
                 ((ulong)*__ptr & 0xff0000000000) >> 0x18 | ((ulong)*__ptr & 0xff00000000) >> 8 |
                 ((ulong)*__ptr & 0xff000000) << 8 | ((ulong)*__ptr & 0xff0000) << 0x18 |
                 ((ulong)*__ptr & 0xff00) << 0x28 | (long)*__ptr << 0x38;
            _pos._4_4_ = *(uint *)((long)&item[-1].field_2 + 0x10) >> 0x18 |
                         (*(uint *)((long)&item[-1].field_2 + 0x10) & 0xff0000) >> 8 |
                         (*(uint *)((long)&item[-1].field_2 + 0x10) & 0xff00) << 8 |
                         *(int *)((long)&item[-1].field_2 + 0x10) << 0x18;
            *(uint64_t *)(doc_offset + bufsize) = _kv_info_offset;
            *(uint *)(doc_offset + (bufsize + 8)) = _pos._4_4_;
            bufsize = bufsize + 0xc;
            if ((ulong)_len <= (ulong)bufsize + 0xc) {
              _len = _len << 1;
              *(undefined8 *)(pcVar4 + -8) = 0x16b345;
              doc_offset = (bid_t)realloc((void *)doc_offset,(ulong)_len);
            }
          }
          plVar2 = *(list **)(*(long *)(revnum_local + 0x48) + 0x280);
          *(undefined8 *)(pcVar4 + -8) = 0x16b366;
          item = (stale_data *)list_remove(plVar2,(list_elem *)item);
          *(undefined8 *)(pcVar4 + -8) = 0x16b379;
          free(__ptr);
        }
      }
      else {
        lVar1 = *(long *)(revnum_local + 0x48);
        *(undefined8 *)(pcVar4 + -8) = 0x16af73;
        for (e = (list_elem *)avl_first((avl_tree *)(lVar1 + 0x298)); e != (list_elem *)0x0;
            e = (list_elem *)avl_next((avl_node *)e)) {
          plVar3 = e + -1;
          if (*(long *)(revnum_local + 0x38) != 0) {
            count_location = count_location + 1;
            _kv_info_offset =
                 (ulong)plVar3->prev >> 0x38 | ((ulong)plVar3->prev & 0xff000000000000) >> 0x28 |
                 ((ulong)plVar3->prev & 0xff0000000000) >> 0x18 |
                 ((ulong)plVar3->prev & 0xff00000000) >> 8 | ((ulong)plVar3->prev & 0xff000000) << 8
                 | ((ulong)plVar3->prev & 0xff0000) << 0x18 | ((ulong)plVar3->prev & 0xff00) << 0x28
                 | (long)plVar3->prev << 0x38;
            _pos._4_4_ = *(uint *)&e[-1].next >> 0x18 | (*(uint *)&e[-1].next & 0xff0000) >> 8 |
                         (*(uint *)&e[-1].next & 0xff00) << 8 | *(int *)&e[-1].next << 0x18;
            *(uint64_t *)(doc_offset + bufsize) = _kv_info_offset;
            *(uint *)(doc_offset + (bufsize + 8)) = _pos._4_4_;
            bufsize = bufsize + 0xc;
            if ((ulong)_len <= (ulong)bufsize + 0xc) {
              _len = _len << 1;
              *(undefined8 *)(pcVar4 + -8) = 0x16b131;
              doc_offset = (bid_t)realloc((void *)doc_offset,(ulong)_len);
            }
          }
          *(undefined8 *)(pcVar4 + -8) = 0x16b147;
        }
      }
      _revnum._7_1_ = 0;
      __s = pcVar4;
      if (count_location != 0) {
        __s = pcVar4 + -0x20;
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b3ae;
        docio_object::docio_object(*(docio_object **)(pcVar4 + -0x18));
        local_60 = count_location >> 0x18 | (count_location & 0xff0000) >> 8 |
                   (count_location & 0xff00) << 8 | count_location << 0x18;
        *(uint *)((doc_offset - 4) + (ulong)_count) = local_60;
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b409;
        memset(&stack0xfffffffffffffec0,0,0x38);
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b422;
        sprintf(__s,"stale_blocks_%lu",prev_hdr_local);
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b447;
        strlen(__s);
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b483;
        _doc_offset = docio_append_doc_system
                                (*(docio_handle **)(pcVar4 + -0x18),*(docio_object **)__s);
        _prev_hdr = _doc_offset >> 0x38 | (_doc_offset & 0xff000000000000) >> 0x28 |
                    (_doc_offset & 0xff0000000000) >> 0x18 | (_doc_offset & 0xff00000000) >> 8 |
                    (_doc_offset & 0xff000000) << 8 | (_doc_offset & 0xff0000) << 0x18 |
                    (_doc_offset & 0xff00) << 0x28 | _doc_offset << 0x38;
        btree = *(btree **)(revnum_local + 0x38);
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b545;
        btree_insert(btree,&_seqnum,&_prev_hdr);
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b552;
        btreeblk_end(*(btreeblk_handle **)(pcVar4 + -0x10));
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b55f;
        btreeblk_reset_subblock_info(*(btreeblk_handle **)(pcVar4 + -0x18));
        if (((delta._7_1_ & 1) == 0) || ((_revnum._6_1_ & 1) == 0)) {
          *(undefined8 *)(pcVar4 + -0x28) = 0x16b5a9;
          fdb_add_inmem_stale_info
                    (*(fdb_kvs_handle **)(pcVar4 + 0x68),*(filemgr_header_revnum_t *)(pcVar4 + 0x60)
                     ,*(docio_object **)(pcVar4 + 0x58),*(uint64_t *)(pcVar4 + 0x50),
                     (bool)pcVar4[0x4f]);
        }
        else {
          *(undefined8 *)(pcVar4 + -0x28) = 0x16b58c;
          fdb_add_inmem_stale_info
                    (*(fdb_kvs_handle **)(pcVar4 + 0x68),*(filemgr_header_revnum_t *)(pcVar4 + 0x60)
                     ,*(docio_object **)(pcVar4 + 0x58),*(uint64_t *)(pcVar4 + 0x50),
                     (bool)pcVar4[0x4f]);
        }
        file = *(filemgr **)(revnum_local + 0x48);
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b5b6;
        plVar2 = filemgr_get_stale_list(file);
        *(undefined8 *)(pcVar4 + -0x28) = 0x16b5be;
        plVar3 = list_begin(plVar2);
        if (plVar3 != (list_elem *)0x0) {
          count_location = 0;
          *(bid_t *)doc_offset = _prev_hdr;
          _revnum._7_1_ = 1;
        }
      }
      _revnum._6_1_ = 0;
      pcVar4 = __s;
    }
    _count = *(long *)(*(long *)(revnum_local + 0x58) + 8) - (long)a;
    *(undefined8 *)(pcVar4 + -8) = 0x16b61c;
    _kvs_stat_update_attr
              (*(filemgr **)(pcVar4 + 0x108),*(fdb_kvs_id_t *)(pcVar4 + 0x100),
               *(kvs_stat_attr_t *)(pcVar4 + 0xfc),*(int64_t *)(pcVar4 + 0xf0));
    _count = (ulong)*(uint *)(revnum_local + 0x74) *
             (*(long *)(*(long *)(revnum_local + 0x58) + 0x10) - (long)a);
    *(undefined8 *)(pcVar4 + -8) = 0x16b65d;
    _kvs_stat_update_attr
              (*(filemgr **)(pcVar4 + 0x108),*(fdb_kvs_id_t *)(pcVar4 + 0x100),
               *(kvs_stat_attr_t *)(pcVar4 + 0xfc),*(int64_t *)(pcVar4 + 0xf0));
    *(undefined8 *)(pcVar4 + -8) = 0x16b666;
    free((void *)doc_offset);
  }
  return;
}

Assistant:

void fdb_gather_stale_blocks(fdb_kvs_handle *handle,
                             filemgr_header_revnum_t revnum,
                             bid_t prev_hdr,
                             uint64_t kv_info_offset,
                             fdb_seqnum_t seqnum,
                             struct list_elem *e_last,
                             bool from_mergetree)
{
    int64_t delta;
    int r;
    uint32_t count = 0;
    uint32_t offset = 0, count_location;
    uint32_t bufsize = 8192;
    uint32_t _count, _len;
    uint64_t _pos, _kv_info_offset;
    uint8_t *buf = NULL;
    bid_t doc_offset, _doc_offset;
    bid_t _prev_hdr;
    bool gather_staleblocks = true;
    bool first_loop = true;
    filemgr_header_revnum_t _revnum;
    fdb_seqnum_t _seqnum;
    struct kvs_stat stat;

    /*
     * << stale block system doc structure >>
     * [previous doc offset]: 8 bytes (0xffff.. if not exist)
     * [previous header BID]: 8 bytes (0xffff.. if not exist)
     * [KVS info doc offset]: 8 bytes (0xffff.. if not exist)
     * [Default KVS seqnum]:  8 bytes
     * [# items]:             4 bytes
     * ---
     * [position]:            8 bytes
     * [length]:              4 bytes
     * ...
     */

    if (filemgr_get_stale_list(handle->file)) {
        struct avl_node *a;
        struct list_elem *e;
        struct stale_data *item;

        r = _kvs_stat_get(handle->file, 0, &stat);
        handle->bhandle->nlivenodes = stat.nlivenodes;
        handle->bhandle->ndeltanodes = stat.nlivenodes;
        (void)r;

        buf = (uint8_t *)calloc(1, bufsize);
        _revnum = _endian_encode(revnum);

        // initial previous doc offset
        memset(buf, 0xff, sizeof(bid_t));
        count_location = sizeof(bid_t);

        // previous header BID
        if (prev_hdr == 0 || prev_hdr == BLK_NOT_FOUND) {
            // does not exist
            memset(&_prev_hdr, 0xff, sizeof(_prev_hdr));
        } else {
            _prev_hdr = _endian_encode(prev_hdr);
        }
        memcpy(buf + sizeof(bid_t), &_prev_hdr, sizeof(bid_t));
        count_location += sizeof(bid_t);

        // KVS info doc offset
        _kv_info_offset = _endian_encode(kv_info_offset);
        memcpy(buf + count_location, &_kv_info_offset, sizeof(uint64_t));
        count_location += sizeof(uint64_t);

        // default KVS seqnum
        _seqnum = _endian_encode(seqnum);
        memcpy(buf + count_location, &_seqnum, sizeof(fdb_seqnum_t));
        count_location += sizeof(fdb_seqnum_t);
        count_location += sizeof(count);

        while(gather_staleblocks) {
            // reserve space for
            // prev offset (8), prev header (8), kv_info_offset (8),
            // seqnum (8), count (4)
            offset = count_location;

            if (first_loop && from_mergetree) {
                // gather from mergetree
                a = avl_first(&handle->file->mergetree);
                while (a) {
                    item = _get_entry(a, struct stale_data, avl);

                    if (handle->staletree) {
                        count++;

                        _pos = _endian_encode(item->pos);
                        _len = _endian_encode(item->len);

                        memcpy(buf + offset, &_pos, sizeof(_pos));
                        offset += sizeof(_pos);
                        memcpy(buf + offset, &_len, sizeof(_len));
                        offset += sizeof(_len);

                        if (offset + sizeof(_pos) + sizeof(_len) >= bufsize) {
                            bufsize *= 2;
                            buf = (uint8_t*)realloc(buf, bufsize);
                        }
                    }


                    // If 'from_mergetree' flag is set, it means that this
                    // function is called at the end of fdb_get_reusable_block(),
                    // and those items are remaining (non-reusable) regions after
                    // picking up reusable blocks from 'mergetree'.

                    // In the previous implementation, those items are converted
                    // and stored as a system document. The document is re-read in
                    // the next block reclaim, and then we reconstruct 'mergetree'
                    // from the document; this is unnecessary duplicated overhead.

                    // As an optimization, we can simply keep those items in
                    // 'mergetree' and use them in the next block reclaim, without
                    // reading the corresponding system document; this also reduces
                    // the commit latency much. Instead, to minimize memory
                    // consumption, we don't need to maintain in-memory copy of the
                    // system doc corresponding to the remaining items in the
                    // 'mergetree', that will be created below.

                    // do not remove the item
                    a = avl_next(&item->avl);
                }
            } else {
                // gater from stale_list
                if (e_last) {
                    e = list_next(e_last);
                } else {
                    e = list_begin(handle->file->stale_list);
                }
                while (e) {
                    item = _get_entry(e, struct stale_data, le);

                    if (handle->staletree) {
                        count++;

                        _pos = _endian_encode(item->pos);
                        _len = _endian_encode(item->len);

                        memcpy(buf + offset, &_pos, sizeof(_pos));
                        offset += sizeof(_pos);
                        memcpy(buf + offset, &_len, sizeof(_len));
                        offset += sizeof(_len);

                        if (offset + sizeof(_pos) + sizeof(_len) >= bufsize) {
                            bufsize *= 2;
                            buf = (uint8_t*)realloc(buf, bufsize);
                        }
                    }

                    e = list_remove(handle->file->stale_list, e);
                    free(item);
                }
            }

            gather_staleblocks = false;
            if (count) {
                char *doc_key = alca(char, 32);
                struct docio_object doc;

                // store count
                _count = _endian_encode(count);
                memcpy(buf + count_location - sizeof(_count), &_count, sizeof(_count));

                // append a system doc
                memset(&doc, 0x0, sizeof(doc));
                // add one to 'revnum' to get the next revision number
                // (note that filemgr_mutex() is grabbed so that no other thread
                //  will change the 'revnum').
                sprintf(doc_key, "stale_blocks_%" _F64, revnum);
                doc.key = (void*)doc_key;
                doc.body = buf;
                doc.length.keylen = strlen(doc_key) + 1;
                doc.length.metalen = 0;
                doc.length.bodylen = offset;
                doc.seqnum = 0;
                doc_offset = docio_append_doc_system(handle->dhandle, &doc);

                // insert into stale-block tree
                _doc_offset = _endian_encode(doc_offset);
                btree_insert(handle->staletree, (void *)&_revnum, (void *)&_doc_offset);
                btreeblk_end(handle->bhandle);
                btreeblk_reset_subblock_info(handle->bhandle);

                if (from_mergetree && first_loop) {
                    // if from_mergetree flag is set and this is the first loop,
                    // stale regions in this document are already in mergetree
                    // so skip adding them into in-memory stale info tree.

                    // however, the system doc itself should be marked as stale
                    // when the doc is reclaimed, thus we instead add a dummy entry
                    // that containing doc offset, length info only.
                    fdb_add_inmem_stale_info(handle, revnum, &doc, doc_offset, true);
                } else {
                    // add the doc into in-memory stale info tree
                    fdb_add_inmem_stale_info(handle, revnum, &doc, doc_offset, false);
                }

                if (list_begin(filemgr_get_stale_list(handle->file))) {
                    // updating stale tree brings another stale blocks.
                    // recursively update until there is no more stale block.

                    // note that infinite loop will not occur because
                    // 1) all updated index blocks for stale tree are still writable
                    // 2) incoming keys for stale tree (revnum) are monotonic
                    //    increasing order; most recently allocated node will be
                    //    updated again.

                    count = 0;
                    // save previous doc offset
                    memcpy(buf, &_doc_offset, sizeof(_doc_offset));

                    // gather once again
                    gather_staleblocks = true;
                }
            }

            first_loop = false;
        } // gather stale blocks

        delta = handle->bhandle->nlivenodes - stat.nlivenodes;
        _kvs_stat_update_attr(handle->file, 0, KVS_STAT_NLIVENODES, delta);
        delta = handle->bhandle->ndeltanodes - stat.nlivenodes;
        delta *= handle->config.blocksize;
        _kvs_stat_update_attr(handle->file, 0, KVS_STAT_DELTASIZE, delta);

        free(buf);
    } else {
        btreeblk_reset_subblock_info(handle->bhandle);
    }
}